

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

void __thiscall asmjit::CodeHolder::CodeHolder(CodeHolder *this)

{
  (this->_codeInfo)._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->_codeInfo).field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  (this->_codeInfo)._baseAddress = 0xffffffffffffffff;
  this->_globalHints = 0;
  this->_globalOptions = 0;
  this->_emitters = (CodeEmitter *)0x0;
  this->_cgAsm = (Assembler *)0x0;
  this->_logger = (Logger *)0x0;
  this->_cgAsm = (Assembler *)0x0;
  this->_logger = (Logger *)0x0;
  this->_errorHandler = (ErrorHandler *)0x0;
  this->_unresolvedLabelsCount = 0;
  this->_trampolinesSize = 0;
  Zone::Zone(&this->_baseZone,0x3fc0,0);
  Zone::Zone(&this->_dataZone,0x3fc0,0);
  (this->_baseHeap)._slots[3] = (Slot *)0x0;
  (this->_baseHeap)._slots[4] = (Slot *)0x0;
  (this->_baseHeap)._slots[5] = (Slot *)0x0;
  (this->_baseHeap)._slots[6] = (Slot *)0x0;
  (this->_baseHeap)._slots[7] = (Slot *)0x0;
  (this->_baseHeap)._slots[8] = (Slot *)0x0;
  (this->_baseHeap)._slots[9] = (Slot *)0x0;
  (this->_baseHeap)._dynamicBlocks = (DynamicBlock *)0x0;
  (this->_baseHeap)._slots[0] = (Slot *)0x0;
  (this->_baseHeap)._slots[1] = (Slot *)0x0;
  (this->_baseHeap)._slots[2] = (Slot *)0x0;
  (this->_baseHeap)._slots[3] = (Slot *)0x0;
  (this->_baseHeap)._slots[4] = (Slot *)0x0;
  (this->_baseHeap)._slots[5] = (Slot *)0x0;
  (this->_baseHeap)._slots[6] = (Slot *)0x0;
  (this->_baseHeap)._slots[7] = (Slot *)0x0;
  (this->_baseHeap)._zone = &this->_baseZone;
  (this->_sections).super_ZoneVectorBase._data = (void *)0x0;
  (this->_sections).super_ZoneVectorBase._length = 0;
  (this->_sections).super_ZoneVectorBase._capacity = 0;
  (this->_labels).super_ZoneVectorBase._data = (void *)0x0;
  (this->_labels).super_ZoneVectorBase._length = 0;
  (this->_labels).super_ZoneVectorBase._capacity = 0;
  (this->_relocations).super_ZoneVectorBase._data = (void *)0x0;
  (this->_relocations).super_ZoneVectorBase._length = 0;
  (this->_relocations).super_ZoneVectorBase._capacity = 0;
  (this->_namedLabels).super_ZoneHashBase._heap = &this->_baseHeap;
  (this->_namedLabels).super_ZoneHashBase._size = 0;
  (this->_namedLabels).super_ZoneHashBase._bucketsCount = 1;
  (this->_namedLabels).super_ZoneHashBase._bucketsGrow = 1;
  (this->_namedLabels).super_ZoneHashBase._data = (this->_namedLabels).super_ZoneHashBase._embedded;
  (this->_namedLabels).super_ZoneHashBase._embedded[0] = (ZoneHashNode *)0x0;
  return;
}

Assistant:

CodeHolder::CodeHolder() noexcept
  : _codeInfo(),
    _globalHints(0),
    _globalOptions(0),
    _emitters(nullptr),
    _cgAsm(nullptr),
    _logger(nullptr),
    _errorHandler(nullptr),
    _unresolvedLabelsCount(0),
    _trampolinesSize(0),
    _baseZone(16384 - Zone::kZoneOverhead),
    _dataZone(16384 - Zone::kZoneOverhead),
    _baseHeap(&_baseZone),
    _namedLabels(&_baseHeap) {}